

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O2

void __thiscall
KeyFileReader<NWN::ResRef16>::KeyFileReader
          (KeyFileReader<NWN::ResRef16> *this,string *FileName,string *InstallDir)

{
  FILE *__stream;
  long lVar1;
  runtime_error *prVar2;
  
  (this->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor =
       (_func_int **)&PTR_OpenFile_001a00c8;
  (this->m_KeyResDir).
  super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_KeyResDir).
  super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_KeyResDir).
  super__Vector_base<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_BifFiles).
  super__Vector_base<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>,_std::allocator<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_BifFiles).
  super__Vector_base<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>,_std::allocator<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_BifFiles).
  super__Vector_base<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>,_std::allocator<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_KeyFileName,(string *)FileName);
  __stream = fopen((FileName->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Failed to open KEY file.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(__stream,0,2);
  lVar1 = ftell(__stream);
  fseek(__stream,0,0);
  if (lVar1 != 0xffffffff) {
    ParseKeyFile(this,(HANDLE)__stream,InstallDir);
    fclose(__stream);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Failed to read file size.");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

KeyFileReader< ResRefT >::KeyFileReader(
	 const std::string & FileName,
	 const std::string & InstallDir
	)
/*++

Routine Description:

	This routine constructs a new KeyFileReader object and parses the contents
	of a KEY file by filename.  The file must already exist as it is
	immediately deserialized.

Arguments:

	FileName - Supplies the path to the KEY file.

	InstallDir - Supplies the installation directory to use for drive 0.  The
	             directory should have a trailing path separator character.
	             The install directory name need only remain valid until the
	             constructor returns.

Return Value:

	The newly constructed object.

Environment:

	User mode.

--*/
: m_KeyFileName( FileName )
{
    HANDLE        File;
    unsigned long FileSize;

#if defined(_WINDOWS)

	File = CreateFileA(
		FileName.c_str( ),
		GENERIC_READ,
		FILE_SHARE_READ | FILE_SHARE_DELETE,
		NULL,
		OPEN_EXISTING,
		FILE_ATTRIBUTE_NORMAL,
		NULL);

	if (File == INVALID_HANDLE_VALUE)
	{
		File = CreateFileA(
				FileName.c_str( ),
				GENERIC_READ,
				FILE_SHARE_READ,
				NULL,
				OPEN_EXISTING,
				FILE_ATTRIBUTE_NORMAL,
				NULL);

		if (File == INVALID_HANDLE_VALUE)
			throw std::exception( "Failed to open KEY file." );
	}

	try
	{
		FileSize = GetFileSize( File, NULL );

		if ((FileSize == 0xFFFFFFFF) && (GetLastError( ) != NO_ERROR))
			throw std::exception( "Failed to read file size." );

		ParseKeyFile( File, InstallDir );
	}
	catch (...)
	{
		CloseHandle( File );

		throw;
	}

	CloseHandle( File );

#else

    File = fopen(FileName.c_str(),"r");

    if (File == nullptr)
        throw std::runtime_error( "Failed to open KEY file." );

    try
    {
        fseek(File, 0 , SEEK_END);
        FileSize = ftell(File);
        fseek(File, 0 , SEEK_SET);// needed for next read from beginning of file


        if ((FileSize == 0xFFFFFFFF))
            throw std::runtime_error( "Failed to read file size." );

        ParseKeyFile( File, InstallDir );
    }
    catch (...)
    {
        fclose( File );

        throw;
    }

    fclose( File );
#endif
}